

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O0

void __thiscall
duckdb::SQLLogicTestLogger::InternalException
          (SQLLogicTestLogger *this,MaterializedQueryResult *result)

{
  SQLLogicTestLogger *in_RDI;
  string *in_stack_ffffffffffffff78;
  allocator *paVar1;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Query failed with internal exception!",&local_31);
  PrintErrorHeader(in_RDI,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  PrintLineSep();
  PrintSQL(this);
  paVar1 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Actual result:",paVar1);
  PrintHeader((string *)in_RDI);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  PrintLineSep();
  duckdb::QueryResult::Print();
  return;
}

Assistant:

void SQLLogicTestLogger::InternalException(MaterializedQueryResult &result) {
	PrintErrorHeader("Query failed with internal exception!");
	PrintLineSep();
	PrintSQL();
	PrintHeader("Actual result:");
	PrintLineSep();
	result.Print();
}